

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

vec3 vec3_rotate_about_axis(vec3 vec,vec3 axis,float theta)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  vec3 vVar8;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 local_48;
  
  fVar6 = axis.z;
  fVar5 = axis.y;
  fVar3 = vec.z;
  fVar1 = cosf(theta);
  fVar2 = sinf(theta);
  local_68 = vec.x;
  uStack_64 = vec.y;
  local_48 = axis.x;
  fVar4 = fVar6 * fVar3 + local_48 * local_68 + uStack_64 * fVar5;
  fVar7 = 1.0 - fVar1;
  vVar8.x = fVar2 * (-fVar6 * uStack_64 + fVar3 * fVar5) +
            fVar7 * fVar4 * local_48 + fVar1 * local_68;
  vVar8.y = fVar2 * (fVar6 * local_68 + fVar3 * -local_48) +
            fVar7 * fVar4 * fVar5 + fVar1 * uStack_64;
  vVar8.z = (uStack_64 * local_48 - fVar5 * local_68) * fVar2 +
            fVar4 * fVar6 * fVar7 + fVar1 * fVar3;
  return vVar8;
}

Assistant:

vec3 vec3_rotate_about_axis(vec3 vec, vec3 axis, float theta) {
    float c = cosf(theta);
    float s = sinf(theta);

    float x = vec.x;
    float y = vec.y;
    float z = vec.z;

    float u = axis.x;
    float v = axis.y;
    float w = axis.z;

    vec3 rotated_vec;
    rotated_vec.x = u * (u * x + v * y + w * z) * (1.0f - c) + x * c + (-w * y + v * z) * s;
    rotated_vec.y = v * (u * x + v * y + w * z) * (1.0f - c) + y * c + (w * x - u * z) * s;
    rotated_vec.z = w * (u * x + v * y + w * z) * (1.0f - c) + z * c + (-v * x + u * y) * s;
    return rotated_vec;
}